

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tables.c
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  FILE *__stream_00;
  char *pcVar6;
  char *expected_path;
  FILE *expected;
  FILE *out;
  char *srcdir;
  FILE *in_stack_00000210;
  FILE *in_stack_000014c0;
  FILE *in_stack_00001ff8;
  FILE *in_stack_00002000;
  char *local_10;
  
  local_10 = getenv("srcdir");
  __stream = tmpfile();
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    die("failed to create temporary file: %s",pcVar3);
  }
  test_table_codec(in_stack_000014c0);
  fprintf(__stream,"----------\n");
  test_dump_value(in_stack_00000210);
  if (local_10 == (char *)0x0) {
    local_10 = ".";
  }
  sVar4 = strlen(local_10);
  sVar5 = strlen(expected_file_name);
  pcVar3 = (char *)malloc(sVar4 + sVar5 + 2);
  if (pcVar3 == (char *)0x0) {
    die("out of memory");
  }
  sprintf(pcVar3,"%s/%s",local_10,expected_file_name);
  __stream_00 = fopen(pcVar3,"r");
  if (__stream_00 == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar6 = strerror(*piVar2);
    die("failed to open %s: %s",pcVar3,pcVar6);
  }
  iVar1 = compare_files(in_stack_00002000,in_stack_00001ff8);
  if (iVar1 != 0) {
    die("output file did not have expected contents");
  }
  fclose(__stream_00);
  free(pcVar3);
  fclose(__stream);
  return 0;
}

Assistant:

int main(void) {
  char *srcdir = getenv("srcdir");
  FILE *out, *expected = NULL;
  char *expected_path;

  out = tmpfile();
  if (out == NULL) {
    die("failed to create temporary file: %s", strerror(errno));
  }

  test_table_codec(out);
  fprintf(out, "----------\n");
  test_dump_value(out);

  if (srcdir == NULL) {
    srcdir = ".";
  }

  expected_path = malloc(strlen(srcdir) + strlen(expected_file_name) + 2);
  if (!expected_path) {
    die("out of memory");
  }
  sprintf(expected_path, "%s/%s", srcdir, expected_file_name);
  expected = fopen(expected_path, "r");
  if (!expected) {
    die("failed to open %s: %s", expected_path, strerror(errno));
  }

  if (compare_files(expected, out)) {
    die("output file did not have expected contents");
  }

  fclose(expected);
  free(expected_path);
  fclose(out);

  return 0;
}